

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_connection.cc
# Opt level: O0

uint16_t __thiscall
QuickConnection::NewestPacketNumber
          (QuickConnection *this,uint16_t base_packet_number,uint16_t packet_number_mask)

{
  undefined4 local_1c;
  undefined2 local_16;
  int i;
  uint16_t number;
  uint16_t packet_number_mask_local;
  uint16_t base_packet_number_local;
  QuickConnection *this_local;
  
  local_16 = base_packet_number;
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    if (((uint)packet_number_mask & 1 << ((byte)local_1c & 0x1f)) != 0) {
      local_16 = base_packet_number + (short)local_1c + 1;
    }
  }
  return local_16;
}

Assistant:

uint16_t QuickConnection::NewestPacketNumber(uint16_t base_packet_number, uint16_t packet_number_mask)
{
	uint16_t number = base_packet_number;
	for (int i = 0; i < MAX_ACK_PACKET_COUNT; i++) {
		if (packet_number_mask & (1 << i)) {
			number = base_packet_number + i + 1;
		}
	}
	return number;
}